

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::swap_assign_op<double>,_0>,_3,_2>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::swap_assign_op<double>,_0>
           *kernel)

{
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::swap_assign_op<double>,_0>,_0,_4>
  ::run(kernel);
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>,_Eigen::internal::swap_assign_op<double>,_0>,_4,_5>
  ::run(kernel);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::DstEvaluatorType::XprType DstXprType;
    typedef typename Kernel::PacketType PacketType;
    
    enum { size = DstXprType::SizeAtCompileTime,
           packetSize =unpacket_traits<PacketType>::size,
           alignedSize = (size/packetSize)*packetSize };

    copy_using_evaluator_innervec_CompleteUnrolling<Kernel, 0, alignedSize>::run(kernel);
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Kernel, alignedSize, size>::run(kernel);
  }